

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gnuplot-iostream.h
# Opt level: O0

ssize_t __thiscall
gnuplotio::Gnuplot::send(Gnuplot *this,int __fd,void *__buf,size_t __n,int __flags)

{
  ssize_t sVar1;
  void *__buf_00;
  undefined4 in_register_00000034;
  PlotGroup local_68;
  PlotGroup *local_18;
  PlotGroup *plot_group_local;
  Gnuplot *this_local;
  
  local_18 = (PlotGroup *)CONCAT44(in_register_00000034,__fd);
  plot_group_local = (PlotGroup *)this;
  PlotGroup::PlotGroup(&local_68,local_18);
  sVar1 = send(this,(int)&local_68,__buf_00,__n,__flags);
  PlotGroup::~PlotGroup(&local_68);
  return sVar1;
}

Assistant:

Gnuplot &send(const PlotGroup &plot_group) {
        return send(PlotGroup(plot_group));
    }